

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split_internal.h
# Opt level: O0

SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
absl::lts_20240722::strings_internal::
SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
::operator++(SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *this)

{
  bool bVar1;
  const_pointer pvVar2;
  const_pointer pvVar3;
  size_type sVar4;
  size_type sVar5;
  undefined1 auVar6 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_58;
  char *local_50;
  undefined1 local_38 [8];
  string_view d;
  string_view text;
  SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_local;
  
  do {
    if (this->state_ == kLastState) {
      this->state_ = kEndState;
      return this;
    }
    join_0x00000010_0x00000000_ =
         Splitter<absl::lts_20240722::ByString,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
         ::text(this->splitter_);
    auVar6 = absl::lts_20240722::ByString::Find(&this->delimiter_,d._M_str,text._M_len,this->pos_);
    d._M_len = auVar6._8_8_;
    local_38 = auVar6._0_8_;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&d._M_str);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&d._M_str);
    if (pvVar2 == pvVar3 + sVar4) {
      this->state_ = kLastState;
    }
    sVar4 = this->pos_;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&d._M_str);
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&d._M_str,sVar4,
                       (long)pvVar2 - (long)(pvVar3 + this->pos_));
    local_58 = bVar7._M_len;
    (this->curr_)._M_len = local_58;
    local_50 = bVar7._M_str;
    (this->curr_)._M_str = local_50;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->curr_);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    this->pos_ = sVar4 + sVar5 + this->pos_;
    bVar1 = AllowEmpty::operator()((AllowEmpty *)&this->field_0x48,this->curr_);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return this;
}

Assistant:

SplitIterator& operator++() {
    do {
      if (state_ == kLastState) {
        state_ = kEndState;
        return *this;
      }
      const absl::string_view text = splitter_->text();
      const absl::string_view d = delimiter_.Find(text, pos_);
      if (d.data() == text.data() + text.size()) state_ = kLastState;
      curr_ = text.substr(pos_,
                          static_cast<size_t>(d.data() - (text.data() + pos_)));
      pos_ += curr_.size() + d.size();
    } while (!predicate_(curr_));
    return *this;
  }